

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

la_ssize_t archive_read_data(archive *_a,void *buff,size_t s)

{
  int iVar1;
  archive *paStack_50;
  int r;
  size_t len;
  size_t bytes_read;
  void *read_buf;
  char *dest;
  archive *a;
  size_t s_local;
  void *buff_local;
  archive *_a_local;
  
  len = 0;
  read_buf = buff;
  dest = (char *)_a;
  a = (archive *)s;
  s_local = (size_t)buff;
  buff_local = _a;
  do {
    if (a == (archive *)0x0) {
      dest[0x80] = '\0';
      dest[0x88] = '\0';
      dest[0x89] = '\0';
      dest[0x8a] = '\0';
      dest[0x8b] = '\0';
      dest[0x8c] = '\0';
      dest[0x8d] = '\0';
      dest[0x8e] = '\0';
      dest[0x8f] = '\0';
      return len;
    }
    if ((*(long *)(dest + 0x68) == *(long *)(dest + 0x70)) && (*(long *)(dest + 0x78) == 0)) {
      bytes_read = *(size_t *)(dest + 0x60);
      dest[0x80] = '\x01';
      *(archive **)(dest + 0x88) = a;
      iVar1 = archive_read_data_block
                        ((archive *)dest,(void **)&bytes_read,(size_t *)(dest + 0x78),
                         (la_int64_t *)(dest + 0x68));
      *(size_t *)(dest + 0x60) = bytes_read;
      if (iVar1 == 1) {
        return len;
      }
      if (iVar1 < 0) {
        return (long)iVar1;
      }
    }
    if (*(long *)(dest + 0x68) < *(long *)(dest + 0x70)) {
      archive_set_error((archive *)dest,0x54,"Encountered out-of-order sparse blocks");
      return -10;
    }
    if ((long)&a->magic + *(long *)(dest + 0x70) < *(long *)(dest + 0x68)) {
      paStack_50 = a;
    }
    else if (*(long *)(dest + 0x70) < *(long *)(dest + 0x68)) {
      paStack_50 = (archive *)(*(long *)(dest + 0x68) - *(long *)(dest + 0x70));
    }
    else {
      paStack_50 = (archive *)0x0;
    }
    memset(read_buf,0,(size_t)paStack_50);
    a = (archive *)((long)a - (long)paStack_50);
    *(long *)(dest + 0x70) = (long)&paStack_50->magic + *(long *)(dest + 0x70);
    read_buf = (void *)((long)&paStack_50->magic + (long)read_buf);
    len = (long)&paStack_50->magic + len;
    if (a != (archive *)0x0) {
      paStack_50 = *(archive **)(dest + 0x78);
      if (a < *(archive **)(dest + 0x78)) {
        paStack_50 = a;
      }
      if (paStack_50 != (archive *)0x0) {
        memcpy(read_buf,*(void **)(dest + 0x60),(size_t)paStack_50);
        a = (archive *)((long)a - (long)paStack_50);
        *(long *)(dest + 0x60) = (long)&paStack_50->magic + *(long *)(dest + 0x60);
        *(long *)(dest + 0x78) = *(long *)(dest + 0x78) - (long)paStack_50;
        *(long *)(dest + 0x70) = (long)&paStack_50->magic + *(long *)(dest + 0x70);
        *(long *)(dest + 0x68) = (long)&paStack_50->magic + *(long *)(dest + 0x68);
        read_buf = (void *)((long)&paStack_50->magic + (long)read_buf);
        len = (long)&paStack_50->magic + len;
      }
    }
  } while( true );
}

Assistant:

la_ssize_t
archive_read_data(struct archive *_a, void *buff, size_t s)
{
	struct archive *a = (struct archive *)_a;
	char	*dest;
	const void *read_buf;
	size_t	 bytes_read;
	size_t	 len;
	int	 r;

	bytes_read = 0;
	dest = (char *)buff;

	while (s > 0) {
		if (a->read_data_offset == a->read_data_output_offset &&
		    a->read_data_remaining == 0) {
			read_buf = a->read_data_block;
			a->read_data_is_posix_read = 1;
			a->read_data_requested = s;
			r = archive_read_data_block(a, &read_buf,
			    &a->read_data_remaining, &a->read_data_offset);
			a->read_data_block = read_buf;
			if (r == ARCHIVE_EOF)
				return (bytes_read);
			/*
			 * Error codes are all negative, so the status
			 * return here cannot be confused with a valid
			 * byte count.  (ARCHIVE_OK is zero.)
			 */
			if (r < ARCHIVE_OK)
				return (r);
		}

		if (a->read_data_offset < a->read_data_output_offset) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encountered out-of-order sparse blocks");
			return (ARCHIVE_RETRY);
		}

		/* Compute the amount of zero padding needed. */
		if (a->read_data_output_offset + (int64_t)s <
		    a->read_data_offset) {
			len = s;
		} else if (a->read_data_output_offset <
		    a->read_data_offset) {
			len = (size_t)(a->read_data_offset -
			    a->read_data_output_offset);
		} else
			len = 0;

		/* Add zeroes. */
		memset(dest, 0, len);
		s -= len;
		a->read_data_output_offset += len;
		dest += len;
		bytes_read += len;

		/* Copy data if there is any space left. */
		if (s > 0) {
			len = a->read_data_remaining;
			if (len > s)
				len = s;
			if (len) {
				memcpy(dest, a->read_data_block, len);
				s -= len;
				a->read_data_block += len;
				a->read_data_remaining -= len;
				a->read_data_output_offset += len;
				a->read_data_offset += len;
				dest += len;
				bytes_read += len;
			}
		}
	}
	a->read_data_is_posix_read = 0;
	a->read_data_requested = 0;
	return (bytes_read);
}